

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O2

int mbedtls_timing_get_delay(void *data)

{
  uint uVar1;
  unsigned_long uVar2;
  mbedtls_timing_delay_context *ctx;
  
  if (*(int *)((long)data + 0x24) != 0) {
    uVar2 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)data,0);
    if (uVar2 < *(uint *)((long)data + 0x24)) {
      uVar1 = (uint)(*(uint *)((long)data + 0x20) <= uVar2);
    }
    else {
      uVar1 = 2;
    }
    return uVar1;
  }
  return -1;
}

Assistant:

int mbedtls_timing_get_delay( void *data )
{
    mbedtls_timing_delay_context *ctx = (mbedtls_timing_delay_context *) data;
    unsigned long elapsed_ms;

    if( ctx->fin_ms == 0 )
        return( -1 );

    elapsed_ms = mbedtls_timing_get_timer( &ctx->timer, 0 );

    if( elapsed_ms >= ctx->fin_ms )
        return( 2 );

    if( elapsed_ms >= ctx->int_ms )
        return( 1 );

    return( 0 );
}